

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateReferencedByShaderCaseBlocks
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *generateBlockContent)

{
  deInt32 *pdVar1;
  int *piVar2;
  GLSLVersion GVar3;
  TestNode *pTVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  ShaderSet *pSVar7;
  Node *pNVar8;
  SharedPtr *enclosing;
  long *plVar9;
  long *plVar10;
  uint uVar11;
  long lVar12;
  SharedPtr stage;
  SharedPtr program;
  SharedPtr program_2;
  SharedPtr local_100;
  Node local_f0;
  SharedPtrStateBase *local_d0;
  Node local_c8;
  SharedPtr *local_a8;
  long *local_a0;
  TestNode *local_98;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_int *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  anon_struct_24_4_e9b1bef3 *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  long local_40;
  char *local_38;
  
  lVar12 = 0xc;
  local_f0.m_enclosingNode.m_ptr._4_4_ = glslVersion;
  local_c8.m_enclosingNode.m_ptr = (Node *)context;
  local_98 = &targetGroup->super_TestNode;
  local_90 = generateBlockContent;
  do {
    pTVar4 = (TestNode *)operator_new(0x78);
    pNVar5 = local_c8.m_enclosingNode.m_ptr;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,(TestContext *)(local_c8.m_enclosingNode.m_ptr)->_vptr_Node,
               *(char **)((long)&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].
                                 name + lVar12 + 4),SSBOArrayLengthTests::init::arraysSized + 1);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar4[1]._vptr_TestNode = (_func_int **)pNVar5;
    GVar3 = *(GLSLVersion *)
             (&generateUniformMatrixStrideCaseBlockContentCases::qualifiers[2].field_0xc + lVar12);
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->m_type = 0;
    (pNVar5->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar5->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b34ac0;
    *(bool *)&pNVar5[1]._vptr_Node = GVar3 != GLSL_VERSION_140;
    local_d0 = (SharedPtrStateBase *)0x0;
    local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_d0 = pSVar6;
    pSVar7 = (ShaderSet *)operator_new(0x28);
    (pSVar7->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00b34b08;
    (pSVar7->super_Node).m_type = TYPE_SHADER;
    (pSVar7->super_Node).m_enclosingNode.m_ptr = pNVar5;
    (pSVar7->super_Node).m_enclosingNode.m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pSVar7->super_Node).m_enclosingNode.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    (pSVar7->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00b34b68;
    pSVar7->m_version = GVar3;
    *(GLSLVersion *)pSVar7->m_stagePresent = local_f0.m_enclosingNode.m_ptr._4_4_;
    local_100.m_state = (SharedPtrStateBase *)0x0;
    local_100.m_ptr = (Node *)pSVar7;
    local_100.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_100.m_state)->strongRefCount = 0;
    (local_100.m_state)->weakRefCount = 0;
    (local_100.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_100.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
    (local_100.m_state)->strongRefCount = 1;
    (local_100.m_state)->weakRefCount = 1;
    tcu::TestNode::addChild(local_98,pTVar4);
    (*local_90)((Context *)local_c8.m_enclosingNode.m_ptr,&local_100,(TestCaseGroup *)pTVar4,
                *(int *)((long)&generateReferencedByShaderCaseBlocks::singleStageCases[0].name +
                        lVar12));
    if (local_100.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_100.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_100.m_ptr = (Node *)0x0;
        (*(local_100.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_100.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_100.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_100.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_d0;
    if (local_d0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_d0->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
        (*local_d0->_vptr_SharedPtrStateBase[2])(local_d0);
      }
      LOCK();
      pdVar1 = &pSVar6->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_d0 != (SharedPtrStateBase *)0x0)) {
        (*local_d0->_vptr_SharedPtrStateBase[1])();
      }
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x6c);
  lVar12 = 0;
  pNVar5 = local_c8.m_enclosingNode.m_ptr;
  do {
    pTVar4 = (TestNode *)operator_new(0x78);
    local_38 = generateReferencedByShaderCaseBlocks::pipelines[lVar12].name;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar4,(TestContext *)pNVar5->_vptr_Node,local_38,
               SSBOArrayLengthTests::init::arraysSized + 1);
    pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
    pTVar4[1]._vptr_TestNode = (_func_int **)pNVar5;
    local_40 = lVar12;
    pNVar8 = (Node *)operator_new(0x28);
    pNVar8->m_type = 0;
    (pNVar8->m_enclosingNode).m_ptr = (Node *)0x0;
    (pNVar8->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
    pNVar8->_vptr_Node = (_func_int **)&PTR__Node_00b34ac0;
    *(undefined1 *)&pNVar8[1]._vptr_Node = 0;
    local_d0 = (SharedPtrStateBase *)0x0;
    local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)pNVar8;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar8;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_d0 = pSVar6;
    pSVar7 = (ShaderSet *)operator_new(0x30);
    local_68 = generateReferencedByShaderCaseBlocks::pipelines + lVar12;
    local_c8.m_enclosingNode.m_state._4_4_ =
         generateReferencedByShaderCaseBlocks::pipelines[lVar12].flags;
    ResourceDefinition::ShaderSet::ShaderSet
              (pSVar7,(SharedPtr *)pNVar8,(GLSLVersion)pSVar6,local_f0.m_enclosingNode.m_ptr._4_4_,
               local_c8.m_enclosingNode.m_state._4_4_);
    tcu::TestNode::addChild(local_98,pTVar4);
    local_100.m_state = (SharedPtrStateBase *)0x0;
    local_100.m_ptr = (Node *)pSVar7;
    local_100.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_100.m_state)->strongRefCount = 0;
    (local_100.m_state)->weakRefCount = 0;
    (local_100.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
    local_100.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
    (local_100.m_state)->strongRefCount = 1;
    (local_100.m_state)->weakRefCount = 1;
    (*local_90)((Context *)pNVar5,&local_100,(TestCaseGroup *)pTVar4,local_68->expandLevel);
    if (local_100.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_100.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_100.m_ptr = (Node *)0x0;
        (*(local_100.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_100.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_100.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_100.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_d0;
    if (local_d0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &local_d0->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)0x0;
        (*local_d0->_vptr_SharedPtrStateBase[2])(local_d0);
      }
      LOCK();
      pdVar1 = &pSVar6->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_d0 != (SharedPtrStateBase *)0x0)) {
        (*local_d0->_vptr_SharedPtrStateBase[1])();
      }
    }
    uVar11 = 0;
    do {
      if ((local_c8.m_enclosingNode.m_state._4_4_ >> (uVar11 & 0x1f) & 1) != 0) {
        enclosing = (SharedPtr *)operator_new(0x28);
        *(undefined4 *)&enclosing->m_state = 0;
        enclosing[1].m_ptr = (Node *)0x0;
        enclosing[1].m_state = (SharedPtrStateBase *)0x0;
        enclosing->m_ptr = (Node *)&PTR__Node_00b34ac0;
        *(undefined1 *)&enclosing[2].m_ptr = 0;
        local_a0 = (long *)0x0;
        local_a8 = enclosing;
        plVar9 = (long *)operator_new(0x20);
        *(undefined4 *)(plVar9 + 1) = 0;
        *(undefined4 *)((long)plVar9 + 0xc) = 0;
        *plVar9 = (long)&PTR__SharedPtrState_00b34b28;
        plVar9[2] = (long)enclosing;
        *(undefined4 *)(plVar9 + 1) = 1;
        *(undefined4 *)((long)plVar9 + 0xc) = 1;
        local_a0 = plVar9;
        pSVar7 = (ShaderSet *)operator_new(0x30);
        ResourceDefinition::ShaderSet::ShaderSet
                  (pSVar7,enclosing,(GLSLVersion)plVar9,local_f0.m_enclosingNode.m_ptr._4_4_,
                   local_c8.m_enclosingNode.m_state._4_4_);
        pNVar5 = local_c8.m_enclosingNode.m_ptr;
        local_60 = &local_50;
        local_58 = 0;
        local_50 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_88 = &local_78;
        plVar10 = plVar9 + 2;
        if ((long *)*plVar9 == plVar10) {
          local_78 = *plVar10;
          lStack_70 = plVar9[3];
        }
        else {
          local_78 = *plVar10;
          local_88 = (long *)*plVar9;
        }
        local_80 = plVar9[1];
        *plVar9 = (long)plVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_88);
        local_100.m_ptr = &local_f0;
        pNVar8 = (Node *)(plVar9 + 2);
        if ((Node *)*plVar9 == pNVar8) {
          local_f0._vptr_Node = pNVar8->_vptr_Node;
          local_f0._8_8_ = plVar9[3];
        }
        else {
          local_f0._vptr_Node = pNVar8->_vptr_Node;
          local_100.m_ptr = (Node *)*plVar9;
        }
        local_100.m_state = (SharedPtrStateBase *)plVar9[1];
        *plVar9 = (long)pNVar8;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_100);
        pNVar8 = (Node *)(plVar9 + 2);
        if ((Node *)*plVar9 == pNVar8) {
          local_c8._vptr_Node = pNVar8->_vptr_Node;
          local_c8._8_8_ = plVar9[3];
          local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)&local_c8;
        }
        else {
          local_c8._vptr_Node = pNVar8->_vptr_Node;
          local_f0.m_enclosingNode.m_state = (SharedPtrStateBase *)*plVar9;
        }
        local_d0 = (SharedPtrStateBase *)plVar9[1];
        *plVar9 = (long)pNVar8;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_100.m_ptr != &local_f0) {
          operator_delete(local_100.m_ptr,(long)local_f0._vptr_Node + 1);
        }
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78 + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
        pTVar4 = (TestNode *)operator_new(0x78);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar4,(TestContext *)pNVar5->_vptr_Node,
                   (char *)local_f0.m_enclosingNode.m_state,
                   SSBOArrayLengthTests::init::arraysSized + 1);
        pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b2a170;
        pTVar4[1]._vptr_TestNode = (_func_int **)pNVar5;
        local_100.m_state = (SharedPtrStateBase *)0x0;
        local_100.m_ptr = (Node *)pSVar7;
        local_100.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_100.m_state)->strongRefCount = 0;
        (local_100.m_state)->weakRefCount = 0;
        (local_100.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b34b28;
        local_100.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pSVar7;
        (local_100.m_state)->strongRefCount = 1;
        (local_100.m_state)->weakRefCount = 1;
        (*local_90)((Context *)pNVar5,&local_100,(TestCaseGroup *)pTVar4,local_68->subExpandLevel);
        tcu::TestNode::addChild(local_98,pTVar4);
        if (local_100.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_100.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_100.m_ptr = (Node *)0x0;
            (*(local_100.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_100.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && (local_100.m_state != (SharedPtrStateBase *)0x0)) {
            (*(local_100.m_state)->_vptr_SharedPtrStateBase[1])();
          }
        }
        if ((Node *)local_f0.m_enclosingNode.m_state != &local_c8) {
          operator_delete(local_f0.m_enclosingNode.m_state,
                          (ulong)((long)(_func_int ***)local_c8._vptr_Node + 1));
        }
        plVar9 = local_a0;
        if (local_a0 != (long *)0x0) {
          LOCK();
          plVar10 = local_a0 + 1;
          *(int *)plVar10 = (int)*plVar10 + -1;
          UNLOCK();
          if ((int)*plVar10 == 0) {
            local_a8 = (SharedPtr *)0x0;
            (**(code **)(*local_a0 + 0x10))(local_a0);
          }
          LOCK();
          piVar2 = (int *)((long)plVar9 + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (local_a0 != (long *)0x0)) {
            (**(code **)(*local_a0 + 8))();
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 6);
    lVar12 = local_40 + 1;
  } while (lVar12 != 4);
  return;
}

Assistant:

static void generateReferencedByShaderCaseBlocks (Context& context, tcu::TestCaseGroup* const targetGroup, glu::GLSLVersion glslVersion, void (*generateBlockContent)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup*, int expandLevel))
{
	static const struct
	{
		const char*		name;
		glu::ShaderType	stage;
		int				expandLevel;
	} singleStageCases[] =
	{
		{ "compute",				glu::SHADERTYPE_COMPUTE,					3	},
		{ "separable_vertex",		glu::SHADERTYPE_VERTEX,						2	},
		{ "separable_fragment",		glu::SHADERTYPE_FRAGMENT,					2	},
		{ "separable_tess_ctrl",	glu::SHADERTYPE_TESSELLATION_CONTROL,		2	},
		{ "separable_tess_eval",	glu::SHADERTYPE_TESSELLATION_EVALUATION,	2	},
		{ "separable_geometry",		glu::SHADERTYPE_GEOMETRY,					2	},
	};
	static const struct
	{
		const char*	name;
		deUint32	flags;
		int			expandLevel;
		int			subExpandLevel;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT),
			3,
			2,
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),
			2,
			2,
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			2,
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
			2,
			1,
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(singleStageCases); ++ndx)
	{
		TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, singleStageCases[ndx].name, "");
		const bool									programSeparable	= (singleStageCases[ndx].stage != glu::SHADERTYPE_COMPUTE);
		const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program(programSeparable));
		const ResourceDefinition::Node::SharedPtr	stage				(new ResourceDefinition::Shader(program, singleStageCases[ndx].stage, glslVersion));

		targetGroup->addChild(blockGroup);

		generateBlockContent(context, stage, blockGroup, singleStageCases[ndx].expandLevel);
	}

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		// whole pipeline
		{
			TestCaseGroup* const						blockGroup			= new TestCaseGroup(context, pipelines[pipelineNdx].name, "");
			const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
			ResourceDefinition::ShaderSet*				shaderSet			= new ResourceDefinition::ShaderSet(program,
																												glslVersion,
																												pipelines[pipelineNdx].flags,
																												pipelines[pipelineNdx].flags);
			targetGroup->addChild(blockGroup);

			{
				const ResourceDefinition::Node::SharedPtr shaders(shaderSet);
				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].expandLevel);
			}
		}

		// only one stage
		for (int selectedStageBit = 0; selectedStageBit < glu::SHADERTYPE_LAST; ++selectedStageBit)
		{
			if (pipelines[pipelineNdx].flags & (1 << selectedStageBit))
			{
				const ResourceDefinition::Node::SharedPtr	program		(new ResourceDefinition::Program());
				ResourceDefinition::ShaderSet*				shaderSet	= new ResourceDefinition::ShaderSet(program,
																											glslVersion,
																											pipelines[pipelineNdx].flags,
																											(1u << selectedStageBit));
				const char*									stageName	= (selectedStageBit == glu::SHADERTYPE_VERTEX)					? ("vertex")
																		: (selectedStageBit == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
																		: (selectedStageBit == glu::SHADERTYPE_GEOMETRY)				? ("geo")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
																		: (selectedStageBit == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
																		: (DE_NULL);
				const std::string							setName		= std::string() + pipelines[pipelineNdx].name + "_only_" + stageName;
				TestCaseGroup* const						blockGroup	= new TestCaseGroup(context, setName.c_str(), "");
				const ResourceDefinition::Node::SharedPtr	shaders		(shaderSet);

				generateBlockContent(context, shaders, blockGroup, pipelines[pipelineNdx].subExpandLevel);
				targetGroup->addChild(blockGroup);
			}
		}
	}
}